

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

bool __thiscall QTextDocumentPrivate::unite(QTextDocumentPrivate *this,uint f)

{
  bool bVar1;
  QChar QVar2;
  QChar QVar3;
  uint uVar4;
  QTextFragmentData *this_00;
  QTextFragmentData *this_01;
  undefined8 in_RDI;
  QTextFragmentData *nf;
  QTextFragmentData *ff;
  uint n;
  uint n_00;
  QChar ch;
  undefined4 in_stack_ffffffffffffffd0;
  undefined2 in_stack_ffffffffffffffd4;
  undefined2 in_stack_ffffffffffffffd6;
  
  n_00 = (uint)((ulong)in_RDI >> 0x20);
  uVar4 = QFragmentMap<QTextFragmentData>::next
                    ((QFragmentMap<QTextFragmentData> *)
                     CONCAT26(in_stack_ffffffffffffffd6,
                              CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),n_00);
  if (uVar4 != 0) {
    this_00 = QFragmentMap<QTextFragmentData>::fragment
                        ((QFragmentMap<QTextFragmentData> *)
                         CONCAT26(in_stack_ffffffffffffffd6,
                                  CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
                         n_00);
    this_01 = QFragmentMap<QTextFragmentData>::fragment
                        ((QFragmentMap<QTextFragmentData> *)
                         CONCAT26(in_stack_ffffffffffffffd6,
                                  CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)),
                         n_00);
    if ((this_01->format == this_00->format) &&
       (this_00->stringPosition + (this_00->super_QFragment<1>).size_array[0] ==
        this_01->stringPosition)) {
      QVar2 = QString::at((QString *)this_01,
                          CONCAT26(in_stack_ffffffffffffffd6,
                                   CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)));
      ch.ucs = (char16_t)((ulong)in_RDI >> 0x30);
      bVar1 = isValidBlockSeparator(ch);
      if (!bVar1) {
        QVar3 = QString::at((QString *)this_01,
                            CONCAT26(QVar2.ucs,
                                     CONCAT24(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)))
        ;
        bVar1 = isValidBlockSeparator(ch);
        if (!bVar1) {
          QFragmentMap<QTextFragmentData>::setSize
                    ((QFragmentMap<QTextFragmentData> *)this_00,(uint)((ulong)this_01 >> 0x20),
                     (int)this_01,CONCAT22(QVar2.ucs,QVar3.ucs));
          QFragmentMap<QTextFragmentData>::erase_single
                    ((QFragmentMap<QTextFragmentData> *)this_00,(uint)((ulong)this_01 >> 0x20));
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool QTextDocumentPrivate::unite(uint f)
{
    uint n = fragments.next(f);
    if (!n)
        return false;

    QTextFragmentData *ff = fragments.fragment(f);
    QTextFragmentData *nf = fragments.fragment(n);

    if (nf->format == ff->format && (ff->stringPosition + (int)ff->size_array[0] == nf->stringPosition)) {
        if (isValidBlockSeparator(text.at(ff->stringPosition))
            || isValidBlockSeparator(text.at(nf->stringPosition)))
            return false;

        fragments.setSize(f, ff->size_array[0] + nf->size_array[0]);
        fragments.erase_single(n);
        return true;
    }
    return false;
}